

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_strings.cpp
# Opt level: O0

error_code __thiscall
pstore::exchange::import_ns::string_mapping::add_string
          (string_mapping *this,not_null<transaction_base_*> transaction,string *str)

{
  reference t;
  transaction_base *ptVar1;
  database *db;
  address a;
  error_code eVar2;
  typed_address<pstore::indirect_string> local_180;
  size_type local_178;
  undefined4 local_170;
  not_null<const_pstore::sstring_view<const_char_*>_*> local_160;
  undefined1 local_158 [8];
  pair<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>::set_iterator<pstore::index::hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>::iterator_base<true>_>,_bool>
  add_res;
  shared_ptr<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>_>
  names_index;
  value_type *s;
  reference local_38;
  string *x;
  string *str_local;
  string_mapping *this_local;
  not_null<transaction_base_*> transaction_local;
  error_category *local_10;
  
  x = str;
  str_local = (string *)this;
  this_local = (string_mapping *)transaction.ptr_;
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->strings_,str);
  local_38 = std::__cxx11::
             list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::back(&this->strings_);
  _s = make_sstring_view(local_38);
  std::__cxx11::
  list<pstore::sstring_view<char_const*>,std::allocator<pstore::sstring_view<char_const*>>>::
  emplace_back<pstore::sstring_view<char_const*>>
            ((list<pstore::sstring_view<char_const*>,std::allocator<pstore::sstring_view<char_const*>>>
              *)&this->views_,(sstring_view<const_char_*> *)&s);
  t = std::__cxx11::
      list<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
      ::back(&this->views_);
  ptVar1 = gsl::not_null<pstore::transaction_base_*>::operator->
                     ((not_null<pstore::transaction_base_*> *)&this_local);
  db = transaction_base::db(ptVar1);
  pstore::index::
  get_index<(pstore::trailer::indices)3,pstore::database,pstore::index::hamt_set<pstore::indirect_string,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>>
            ((index *)&add_res.second,db,true);
  ptVar1 = gsl::not_null::operator_cast_to_transaction_base_((not_null *)&this_local);
  gsl::not_null<const_pstore::sstring_view<const_char_*>_*>::not_null(&local_160,t);
  indirect_string_adder::
  add<pstore::index::hamt_set<pstore::indirect_string,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>>
            ((pair<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>::set_iterator<pstore::index::hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>::iterator_base<true>_>,_bool>
              *)local_158,&this->adder_,ptVar1,
             (shared_ptr<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>_>
              *)&add_res.second,local_160);
  if (((byte)add_res.first.it_.pos_._M_t.
             super___uniq_ptr_impl<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>,_std::default_delete<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_*,_std::default_delete<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_>_>
             .
             super__Head_base<0UL,_std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_*,_false>
             ._M_head_impl & 1) == 0) {
    std::error_code::error_code<pstore::exchange::import_ns::error,void>
              ((error_code *)&transaction_local,duplicate_name);
  }
  else {
    local_178 = std::
                unordered_map<unsigned_long,_pstore::typed_address<pstore::indirect_string>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_pstore::typed_address<pstore::indirect_string>_>_>_>
                ::size(&this->lookup_);
    a = pstore::index::
        hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
        ::
        set_iterator<pstore::index::hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>::iterator_base<true>_>
        ::get_address((set_iterator<pstore::index::hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>::iterator_base<true>_>
                       *)local_158);
    local_180 = typed_address<pstore::indirect_string>::make(a);
    std::
    unordered_map<unsigned_long,pstore::typed_address<pstore::indirect_string>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,pstore::typed_address<pstore::indirect_string>>>>
    ::emplace<unsigned_long,pstore::typed_address<pstore::indirect_string>>
              ((unordered_map<unsigned_long,pstore::typed_address<pstore::indirect_string>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,pstore::typed_address<pstore::indirect_string>>>>
                *)&this->lookup_,&local_178,&local_180);
    std::error_code::error_code((error_code *)&transaction_local);
  }
  local_170 = 1;
  std::
  pair<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>::set_iterator<pstore::index::hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>::iterator_base<true>_>,_bool>
  ::~pair((pair<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>::set_iterator<pstore::index::hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>::iterator_base<true>_>,_bool>
           *)local_158);
  std::
  shared_ptr<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>_>
  ::~shared_ptr((shared_ptr<pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>_>
                 *)&add_res.second);
  eVar2._4_4_ = 0;
  eVar2._M_value = (uint)transaction_local.ptr_;
  eVar2._M_cat = local_10;
  return eVar2;
}

Assistant:

std::error_code
            string_mapping::add_string (not_null<transaction_base *> const transaction,
                                        std::string const & str) {
                strings_.push_back (str);
                std::string const & x = strings_.back ();

                views_.emplace_back (make_sstring_view (x));
                auto & s = views_.back ();

                std::shared_ptr<index::name_index> const names_index =
                    index::get_index<trailer::indices::name> (transaction->db ());
                std::pair<index::name_index::iterator, bool> const add_res =
                    adder_.add (*transaction, names_index, &s);
                if (!add_res.second) {
                    return error::duplicate_name;
                }

                lookup_.emplace (lookup_.size (), typed_address<indirect_string>::make (
                                                      add_res.first.get_address ()));
                return {};
            }